

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_TtFindLastDiffBit(word *pIn1,word *pIn2,int nVars)

{
  int iVar1;
  int local_28;
  int nWords;
  int w;
  int nVars_local;
  word *pIn2_local;
  word *pIn1_local;
  
  local_28 = Abc_TtWordNum(nVars);
  do {
    local_28 = local_28 + -1;
    if (local_28 < 0) {
      return -1;
    }
  } while (pIn1[local_28] == pIn2[local_28]);
  iVar1 = Abc_Tt6LastBit(pIn1[local_28] ^ pIn2[local_28]);
  return local_28 * 0x40 + iVar1;
}

Assistant:

static inline int Abc_TtFindLastDiffBit( word * pIn1, word * pIn2, int nVars )
{
    int w, nWords = Abc_TtWordNum(nVars);
    for ( w = nWords - 1; w >= 0; w-- )
        if ( pIn1[w] ^ pIn2[w] )
            return 64*w + Abc_Tt6LastBit(pIn1[w] ^ pIn2[w]);
    return -1;
}